

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

RandomSampler * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::RandomSampler,int&,int&>
          (polymorphic_allocator<std::byte> *this,int *args,int *args_1)

{
  int iVar1;
  undefined4 extraout_var;
  RandomSampler *pRVar2;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x18,8);
  pRVar2 = (RandomSampler *)CONCAT44(extraout_var,iVar1);
  iVar1 = *args_1;
  pRVar2->samplesPerPixel = *args;
  pRVar2->seed = iVar1;
  (pRVar2->rng).state = 0x853c49e6748fea9b;
  (pRVar2->rng).inc = 0xda3e39cb94b95bdb;
  return pRVar2;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }